

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

HighsStatus
normaliseNames(HighsLogOptions *log_options,string *name_type,HighsInt num_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *names,HighsInt *max_name_length)

{
  int iVar1;
  bool bVar2;
  HighsInt HVar3;
  int iVar4;
  ulong uVar5;
  HighsStatus HVar6;
  ulong uVar7;
  long lVar8;
  HighsStatus local_a8;
  string name_prefix;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = *max_name_length;
  lVar8 = 0;
  std::__cxx11::string::substr((ulong)&name_prefix,(ulong)name_type);
  uVar7 = 0;
  if (0 < num_name) {
    uVar7 = (ulong)(uint)num_name;
  }
  iVar4 = 0;
  for (; uVar7 << 5 != lVar8; lVar8 = lVar8 + 0x20) {
    iVar4 = iVar4 + (uint)(*(int *)((long)&((names->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_string_length + lVar8) == 0);
  }
  if (iVar4 == 0) {
    HVar3 = maxNameLength(num_name,names);
    *max_name_length = HVar3;
    if (HVar3 <= iVar1) {
      bVar2 = hasNamesWithSpaces(log_options,num_name,names);
      local_a8 = kOk;
      goto LAB_0026509e;
    }
  }
  highsLogUser(log_options,kWarning,
               "There are empty or excessively-long %s names: using constructed names with prefix \"%s\"\n"
               ,(name_type->_M_dataplus)._M_p,name_prefix._M_dataplus._M_p);
  lVar8 = 0;
  local_a8 = kWarning;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    std::__cxx11::to_string(&local_70,(int)uVar5);
    std::operator+(&local_50,&name_prefix,&local_70);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
               (string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    lVar8 = lVar8 + 0x20;
  }
  bVar2 = false;
LAB_0026509e:
  HVar3 = maxNameLength(num_name,names);
  HVar6 = kError;
  if (HVar3 < 9) {
    HVar6 = local_a8;
  }
  *max_name_length = HVar3;
  if (bVar2 == false) {
    HVar6 = local_a8;
  }
  std::__cxx11::string::~string((string *)&name_prefix);
  return HVar6;
}

Assistant:

HighsStatus normaliseNames(const HighsLogOptions& log_options,
                           const std::string name_type, const HighsInt num_name,
                           std::vector<std::string>& names,
                           HighsInt& max_name_length) {
  // Record the desired maximum name length
  HighsInt desired_max_name_length = max_name_length;
  // First look for empty names
  HighsInt num_empty_name = 0;
  std::string name_prefix = name_type.substr(0, 1);
  bool names_with_spaces = false;
  for (HighsInt ix = 0; ix < num_name; ix++) {
    if ((HighsInt)names[ix].length() == 0) num_empty_name++;
  }
  // If there are no empty names - in which case they will all be
  // replaced - find the maximum name length
  if (!num_empty_name) max_name_length = maxNameLength(num_name, names);
  bool construct_names =
      num_empty_name || max_name_length > desired_max_name_length;
  if (construct_names) {
    // Construct names, either because they are empty names, or
    // because the existing names are too long

    highsLogUser(log_options, HighsLogType::kWarning,
                 "There are empty or excessively-long %s names: using "
                 "constructed names with prefix \"%s\"\n",
                 name_type.c_str(), name_prefix.c_str());
    for (HighsInt ix = 0; ix < num_name; ix++)
      names[ix] = name_prefix + std::to_string(ix);
  } else {
    // Using original names, so look to see whether there are names with spaces
    names_with_spaces = hasNamesWithSpaces(log_options, num_name, names);
  }
  // Find the final maximum name length
  max_name_length = maxNameLength(num_name, names);
  // Can't have names with spaces and more than 8 characters
  if (max_name_length > 8 && names_with_spaces) return HighsStatus::kError;
  if (construct_names) return HighsStatus::kWarning;
  return HighsStatus::kOk;
}